

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

LoopConstraintSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::LoopConstraintSyntax,slang::syntax::LoopConstraintSyntax_const&>
          (BumpAllocator *this,LoopConstraintSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  Info *pIVar3;
  ForeachLoopListSyntax *pFVar4;
  undefined4 uVar5;
  TokenKind TVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  LoopConstraintSyntax *pLVar10;
  
  pLVar10 = (LoopConstraintSyntax *)allocate(this,0x38,8);
  uVar5 = *(undefined4 *)&(args->super_ConstraintItemSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_ConstraintItemSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_ConstraintItemSyntax).super_SyntaxNode.previewNode;
  TVar6 = (args->foreachKeyword).kind;
  uVar7 = (args->foreachKeyword).field_0x2;
  NVar8.raw = (args->foreachKeyword).numFlags.raw;
  uVar9 = (args->foreachKeyword).rawLen;
  pIVar3 = (args->foreachKeyword).info;
  pFVar4 = (args->loopList).ptr;
  (pLVar10->super_ConstraintItemSyntax).super_SyntaxNode.kind =
       (args->super_ConstraintItemSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pLVar10->super_ConstraintItemSyntax).super_SyntaxNode.field_0x4 = uVar5;
  (pLVar10->super_ConstraintItemSyntax).super_SyntaxNode.parent = pSVar1;
  (pLVar10->super_ConstraintItemSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pLVar10->foreachKeyword).kind = TVar6;
  (pLVar10->foreachKeyword).field_0x2 = uVar7;
  (pLVar10->foreachKeyword).numFlags = (NumericTokenFlags)NVar8.raw;
  (pLVar10->foreachKeyword).rawLen = uVar9;
  (pLVar10->foreachKeyword).info = pIVar3;
  (pLVar10->loopList).ptr = pFVar4;
  (pLVar10->constraints).ptr = (args->constraints).ptr;
  return pLVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }